

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeGetNumMassMult(void *arkode_mem,long *nmvevals)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x793;
LAB_0013d4c3:
    arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetNumMassMult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  else {
    if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
      *nmvevals = 0;
    }
    else {
      lVar1 = (**(code **)((long)arkode_mem + 0x200))(arkode_mem);
      if (lVar1 == 0) {
        msgfmt = "Mass matrix solver memory is NULL.";
        iVar2 = -6;
        error_code = -6;
        line = 0xfe9;
        goto LAB_0013d4c3;
      }
      *nmvevals = *(long *)(lVar1 + 0x60);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeGetNumMassMult(void* arkode_mem, long int* nmvevals)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *nmvevals = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *nmvevals = arkls_mem->nmtimes;
  return (ARKLS_SUCCESS);
}